

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

int __thiscall BpTree<int>::FindFirstKey(BpTree<int> *this,int k,Addr *p)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  IndexNode<int> local_168;
  Addr local_108;
  Addr local_100;
  undefined1 local_e8 [8];
  IndexNode<int> D;
  IndexNode<int> C;
  int pos;
  int i;
  Addr *p_local;
  int k_local;
  BpTree<int> *this_local;
  
  *p = this->RootAddr;
  IndexNode<int>::IndexNode((IndexNode<int> *)&D.self,this->N);
  IndexNode<int>::IndexNode((IndexNode<int> *)local_e8,this->N);
  local_100 = *p;
  FindNode(this,local_100,(IndexNode<int> *)&D.self);
  while ((char)D.self.BlockNum != '1') {
    C.self.FileOff = 0;
    while( true ) {
      bVar1 = false;
      if (C.self.FileOff < this->N + -1) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)C.self.FileOff);
        bVar1 = false;
        if (*pvVar3 == '1') {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&C,(long)C.self.FileOff);
          bVar1 = *pvVar4 < k;
        }
      }
      if (!bVar1) break;
      C.self.FileOff = C.self.FileOff + 1;
    }
    if ((C.self.FileOff == this->N + -1) ||
       (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)C.self.FileOff),
       *pvVar3 == '0')) {
      pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)C.self.FileOff);
      iVar2 = pvVar5->FileOff;
      p->BlockNum = pvVar5->BlockNum;
      p->FileOff = iVar2;
    }
    else {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&C,(long)C.self.FileOff);
      if (k == *pvVar4) {
        pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)C.self.FileOff);
        local_108.BlockNum = pvVar5->BlockNum;
        local_108.FileOff = pvVar5->FileOff;
        FindNode(this,local_108,(IndexNode<int> *)local_e8);
        IndexNode<int>::IndexNode(&local_168,(IndexNode<int> *)local_e8);
        iVar2 = HaveK(this,&local_168,k);
        IndexNode<int>::~IndexNode(&local_168);
        if (iVar2 == 0) {
          pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)(C.self.FileOff + 1));
          iVar2 = pvVar5->FileOff;
          p->BlockNum = pvVar5->BlockNum;
          p->FileOff = iVar2;
        }
        else {
          pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)C.self.FileOff);
          iVar2 = pvVar5->FileOff;
          p->BlockNum = pvVar5->BlockNum;
          p->FileOff = iVar2;
        }
      }
      else {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&C,(long)C.self.FileOff);
        if (k < *pvVar4) {
          pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)C.self.FileOff);
          iVar2 = pvVar5->FileOff;
          p->BlockNum = pvVar5->BlockNum;
          p->FileOff = iVar2;
        }
      }
    }
    FindNode(this,*p,(IndexNode<int> *)&D.self);
  }
  C.self.BlockNum = 0;
  while( true ) {
    bVar1 = false;
    if (C.self.BlockNum < this->N + -1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&C,(long)C.self.BlockNum);
      bVar1 = *pvVar4 < k;
    }
    iVar2 = C.self.BlockNum;
    if (!bVar1) break;
    C.self.BlockNum = C.self.BlockNum + 1;
  }
  IndexNode<int>::~IndexNode((IndexNode<int> *)local_e8);
  IndexNode<int>::~IndexNode((IndexNode<int> *)&D.self);
  return iVar2;
}

Assistant:

int BpTree<K>::FindFirstKey(K k, Addr& p) {
	int i, pos;
	p = this->RootAddr;
	IndexNode<K> C(N);
	IndexNode<K> D(N);
	this->FindNode(p, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			p = C.p[i];
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if (this->HaveK(D, k))
				p = C.p[i];			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				p = C.p[i + 1];		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			p = C.p[i];
		}
		this->FindNode(p, C);
	}
	for (pos = 0; pos < N - 1 && C.k[pos] < k; pos++);
	return pos;
}